

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

int __thiscall
anon_unknown.dwarf_9f4198::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,int index,size_t count)

{
  ostream *poVar1;
  runtime_error *this_00;
  uint uVar2;
  ostringstream str;
  string local_1c0 [32];
  ostream local_1a0;
  
  uVar2 = (index >> 0x1f & (uint)count) + index;
  if ((-1 < (int)uVar2) && (uVar2 < count)) {
    return uVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1a0,"sub-command TRANSFORM, selector ",0x20);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (&local_1a0,(this->super_TransformSelector).Tag._M_dataplus._M_p,
                      (this->super_TransformSelector).Tag._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", index: ",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," out of range (-",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,").",2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  *(undefined ***)this_00 = &PTR__runtime_error_0062e6f0;
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

int NormalizeIndex(int index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<int>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      std::ostringstream str;
      str << "sub-command TRANSFORM, selector " << this->Tag
          << ", index: " << index << " out of range (-" << count << ", "
          << count - 1 << ").";
      throw transform_error(str.str());
    }
    return index;
  }